

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::ValidateWindow4Quads
          (ShaderStorageBufferObjectBase *this,vec3 *lb,vec3 *rb,vec3 *rt,vec3 *lt,int *bad_pixels)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference pvVar9;
  float *pfVar10;
  uint local_22c;
  Vector<float,_3> local_f4;
  int local_e8;
  uint local_e4;
  int idx_5;
  int x_5;
  int y_5;
  int local_d0;
  uint local_cc;
  int idx_4;
  int x_4;
  int y_4;
  int idx_3;
  int x_3;
  int y_3;
  int idx_2;
  int x_2;
  int y_2;
  int idx_1;
  int x_1;
  int y_1;
  int idx;
  int x;
  int y;
  int bad;
  bool status;
  allocator<tcu::Vector<float,_3>_> local_79;
  undefined1 local_78 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  int height;
  int width;
  vec4 g_color_eps;
  PixelFormat *pixelFormat;
  RenderTarget *renderTarget;
  int *bad_pixels_local;
  vec3 *lt_local;
  vec3 *rt_local;
  vec3 *rb_local;
  vec3 *lb_local;
  ShaderStorageBufferObjectBase *this_local;
  
  pRVar8 = deqp::Context::getRenderContext((this->super_SubcaseBase).super_GLWrapper.m_context);
  iVar7 = (*pRVar8->_vptr_RenderContext[4])();
  g_color_eps.m_data._8_8_ =
       tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar7));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&height,
             1.0 / (float)(1 << ((byte)((PixelFormat *)g_color_eps.m_data._8_8_)->redBits & 0x1f)),
             1.0 / (float)(1 << ((byte)((PixelFormat *)g_color_eps.m_data._8_8_)->greenBits & 0x1f))
             ,1.0 / (float)(1 << ((byte)((PixelFormat *)g_color_eps.m_data._8_8_)->blueBits & 0x1f))
             ,1.0 / (float)(1 << ((byte)((PixelFormat *)g_color_eps.m_data._8_8_)->alphaBits & 0x1f)
                           ));
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 100;
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 100;
  std::allocator<tcu::Vector<float,_3>_>::allocator(&local_79);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_78,
             10000,&local_79);
  std::allocator<tcu::Vector<float,_3>_>::~allocator(&local_79);
  pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                     ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                      local_78,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,100,100,0x1907,
             0x1406,pvVar9);
  y._3_1_ = 1;
  x = 0;
  for (idx = 10; idx < 0x28; idx = idx + 1) {
    for (y_1 = 10; y_1 < 0x28; y_1 = y_1 + 1) {
      x_1 = idx * 100 + y_1;
      pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_78,(long)x_1);
      bVar6 = ColorEqual(this,pvVar9,lb,(vec4 *)&height);
      iVar4 = idx;
      iVar7 = y_1;
      if (!bVar6) {
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_1);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,0);
        fVar1 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_1);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,1);
        fVar2 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_1);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,2);
        anon_unknown_0::Output
                  ("First bad color (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,
                   (double)*pfVar10,(ulong)(uint)iVar7,(ulong)(uint)iVar4);
        y._3_1_ = 0;
        x = x + 1;
      }
    }
  }
  if ((y._3_1_ & 1) == 0) {
    anon_unknown_0::Output("Left-bottom quad checking failed. Bad pixels: %d",(ulong)(uint)x);
  }
  for (idx_1 = 10; idx_1 < 0x28; idx_1 = idx_1 + 1) {
    for (y_2 = 0x3c; y_2 < 0x5a; y_2 = y_2 + 1) {
      x_2 = idx_1 * 100 + y_2;
      pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_78,(long)x_2);
      bVar6 = ColorEqual(this,pvVar9,rb,(vec4 *)&height);
      iVar4 = idx_1;
      iVar7 = y_2;
      if (!bVar6) {
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_2);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,0);
        fVar1 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_2);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,1);
        fVar2 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_2);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,2);
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,(double)*pfVar10,
                   (ulong)(uint)iVar7,(ulong)(uint)iVar4);
        y._3_1_ = 0;
        x = x + 1;
      }
    }
  }
  if ((y._3_1_ & 1) == 0) {
    anon_unknown_0::Output("right-bottom quad checking failed. Bad pixels: %d",(ulong)(uint)x);
  }
  for (idx_2 = 0x3c; idx_2 < 0x5a; idx_2 = idx_2 + 1) {
    for (y_3 = 0x3c; y_3 < 0x5a; y_3 = y_3 + 1) {
      x_3 = idx_2 * 100 + y_3;
      pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_78,(long)x_3);
      bVar6 = ColorEqual(this,pvVar9,rt,(vec4 *)&height);
      iVar4 = idx_2;
      iVar7 = y_3;
      if (!bVar6) {
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_3);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,0);
        fVar1 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_3);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,1);
        fVar2 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_3);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,2);
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,(double)*pfVar10,
                   (ulong)(uint)iVar7,(ulong)(uint)iVar4);
        y._3_1_ = 0;
        x = x + 1;
      }
    }
  }
  if ((y._3_1_ & 1) == 0) {
    anon_unknown_0::Output("right-top quad checking failed. Bad pixels: %d",(ulong)(uint)x);
  }
  for (idx_3 = 0x3c; idx_3 < 0x5a; idx_3 = idx_3 + 1) {
    for (y_4 = 10; y_4 < 0x28; y_4 = y_4 + 1) {
      x_4 = idx_3 * 100 + y_4;
      pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_78,(long)x_4);
      bVar6 = ColorEqual(this,pvVar9,lt,(vec4 *)&height);
      iVar4 = idx_3;
      iVar7 = y_4;
      if (!bVar6) {
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_4);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,0);
        fVar1 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_4);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,1);
        fVar2 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)x_4);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,2);
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,(double)*pfVar10,
                   (ulong)(uint)iVar7,(ulong)(uint)iVar4);
        y._3_1_ = 0;
        x = x + 1;
      }
    }
  }
  if ((y._3_1_ & 1) == 0) {
    anon_unknown_0::Output("left-top quad checking failed. Bad pixels: %d",(ulong)(uint)x);
  }
  for (idx_4 = 0x30; idx_4 < 0x34; idx_4 = idx_4 + 1) {
    for (local_cc = 0; (int)local_cc < 100; local_cc = local_cc + 1) {
      local_d0 = idx_4 * 100 + local_cc;
      pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_78,(long)local_d0);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&x_5,0.0);
      bVar6 = ColorEqual(this,pvVar9,(vec3 *)&x_5,(vec4 *)&height);
      iVar7 = idx_4;
      uVar3 = local_cc;
      if (((bVar6 ^ 0xffU) & 1) != 0) {
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)local_d0);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,0);
        fVar1 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)local_d0);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,1);
        fVar2 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)local_d0);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,2);
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,(double)*pfVar10,
                   (ulong)uVar3,(ulong)(uint)iVar7);
        y._3_1_ = 0;
        x = x + 1;
      }
    }
  }
  if ((y._3_1_ & 1) == 0) {
    anon_unknown_0::Output("middle horizontal line checking failed. Bad pixels: %d",(ulong)(uint)x);
  }
  for (idx_5 = 0; idx_5 < 100; idx_5 = idx_5 + 1) {
    for (local_e4 = 0x30; (int)local_e4 < 0x34; local_e4 = local_e4 + 1) {
      local_e8 = idx_5 * 100 + local_e4;
      pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_78,(long)local_e8);
      tcu::Vector<float,_3>::Vector(&local_f4,0.0);
      bVar6 = ColorEqual(this,pvVar9,&local_f4,(vec4 *)&height);
      iVar7 = idx_5;
      uVar3 = local_e4;
      if (((bVar6 ^ 0xffU) & 1) != 0) {
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)local_e8);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,0);
        fVar1 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)local_e8);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,1);
        fVar2 = *pfVar10;
        pvVar9 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_78,(long)local_e8);
        pfVar10 = tcu::Vector<float,_3>::operator[](pvVar9,2);
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,(double)*pfVar10,
                   (ulong)uVar3,(ulong)(uint)iVar7);
        y._3_1_ = 0;
        x = x + 1;
      }
    }
  }
  if ((y._3_1_ & 1) == 0) {
    anon_unknown_0::Output("middle vertical line checking failed. Bad pixels: %d",(ulong)(uint)x);
  }
  if (bad_pixels == (int *)0x0) {
    local_22c = 0;
  }
  else {
    *bad_pixels = x;
    local_22c = *bad_pixels;
  }
  anon_unknown_0::Output("Bad pixels:%d, counted bad:%d\n",(ulong)local_22c,(ulong)(uint)x);
  bVar5 = y._3_1_;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_78);
  return (bool)(bVar5 & 1);
}

Assistant:

bool ValidateWindow4Quads(const vec3& lb, const vec3& rb, const vec3& rt, const vec3& lt, int* bad_pixels = NULL)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		const int		  width  = 100;
		const int		  height = 100;
		std::vector<vec3> fb(width * height);
		glReadPixels(0, 0, width, height, GL_RGB, GL_FLOAT, &fb[0]);

		bool status = true;
		int  bad	= 0;

		// left-bottom quad
		for (int y = 10; y < height / 2 - 10; ++y)
		{
			for (int x = 10; x < width / 2 - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], lb, g_color_eps))
				{
					Output("First bad color (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("Left-bottom quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// right-bottom quad
		for (int y = 10; y < height / 2 - 10; ++y)
		{
			for (int x = width / 2 + 10; x < width - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], rb, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("right-bottom quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// right-top quad
		for (int y = height / 2 + 10; y < height - 10; ++y)
		{
			for (int x = width / 2 + 10; x < width - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], rt, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("right-top quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// left-top quad
		for (int y = height / 2 + 10; y < height - 10; ++y)
		{
			for (int x = 10; x < width / 2 - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], lt, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("left-top quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// middle horizontal line should be black
		for (int y = height / 2 - 2; y < height / 2 + 2; ++y)
		{
			for (int x = 0; x < width; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], vec3(0), g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("middle horizontal line checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// middle vertical line should be black
		for (int y = 0; y < height; ++y)
		{
			for (int x = width / 2 - 2; x < width / 2 + 2; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], vec3(0), g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("middle vertical line checking failed. Bad pixels: %d", bad);
			//return status;
		}

		if (bad_pixels)
			*bad_pixels = bad;
		Output("Bad pixels:%d, counted bad:%d\n", bad_pixels == NULL ? 0 : *bad_pixels, bad);
		return status;
	}